

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

void __thiscall Propagator::init_compatible(Propagator *this)

{
  pointer paVar1;
  uint y;
  ulong uVar2;
  uint x;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  pointer *ppuVar6;
  long lVar7;
  array<int,_4UL> value;
  
  for (uVar2 = 0; uVar2 < this->wave_height; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar3 < this->wave_width; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < this->patterns_size; uVar4 = uVar4 + 1) {
        ppuVar6 = (pointer *)
                  ((long)&(this->propagator_state).
                          super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_elems[3].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8);
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          value._M_elems[lVar7] =
               (int)((ulong)((long)*ppuVar6 - (long)((_Vector_impl_data *)(ppuVar6 + -1))->_M_start)
                    >> 2);
          ppuVar6 = ppuVar6 + -3;
        }
        paVar1 = (this->compatible).data.
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 ((this->compatible).width * uVar2 + uVar3) * (this->compatible).depth + uVar5;
        *(undefined8 *)paVar1->_M_elems = value._M_elems._0_8_;
        *(undefined8 *)(paVar1->_M_elems + 2) = value._M_elems._8_8_;
      }
    }
  }
  return;
}

Assistant:

void Propagator::init_compatible() noexcept {
  std::array<int, 4> value;
  // We compute the number of pattern compatible in all directions.
  for (unsigned y = 0; y < wave_height; y++) {
    for (unsigned x = 0; x < wave_width; x++) {
      for (unsigned pattern = 0; pattern < patterns_size; pattern++) {
        for (int direction = 0; direction < 4; direction++) {
          value[direction] =
            static_cast<unsigned>(propagator_state[pattern][get_opposite_direction(direction)]
                                  .size());
        }
        compatible.get(y, x, pattern) = value;
      }
    }
  }
}